

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void jpgd::jpeg_decoder::decode_block_ac_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  uint uVar1;
  uint uVar2;
  jpgd_block_coeff_t *pjVar3;
  int iVar4;
  int iVar5;
  uint num_bits;
  
  iVar5 = pD->m_eob_run;
  if (iVar5 == 0) {
    pjVar3 = coeff_buf_getp(pD,pD->m_ac_coeffs[component_id],block_x,block_y);
    iVar5 = pD->m_spectral_start;
    while (iVar5 <= pD->m_spectral_end) {
      if (7 < (ulong)(uint)pD->m_comp_ac_tab[component_id]) {
LAB_0013f7f7:
        stop_decoding(pD,JPGD_DECODE_ERROR);
      }
      uVar1 = huff_decode(pD,pD->m_pHuff_tabs[(uint)pD->m_comp_ac_tab[component_id]]);
      iVar4 = (int)uVar1 >> 4;
      num_bits = uVar1 & 0xf;
      if (num_bits == 0) {
        if (iVar4 != 0xf) {
          iVar5 = 1 << ((byte)iVar4 & 0x1f);
          pD->m_eob_run = iVar5;
          if (0xf < uVar1) {
            uVar2 = get_bits_no_markers(pD,iVar4);
            iVar5 = uVar2 + pD->m_eob_run;
          }
          goto LAB_0013f6f2;
        }
        if (0x30 < iVar5) goto LAB_0013f7f7;
        iVar4 = iVar5 + 0xf;
      }
      else {
        iVar4 = iVar4 + iVar5;
        if (0x3f < iVar4) goto LAB_0013f7f7;
        uVar2 = get_bits_no_markers(pD,num_bits);
        if ((int)uVar2 < *(int *)(s_extend_test + (ulong)num_bits * 4)) {
          uVar2 = uVar2 + *(int *)(s_extend_offset + (ulong)num_bits * 4);
        }
        pjVar3[*(int *)(g_ZAG + (long)iVar4 * 4)] =
             (jpgd_block_coeff_t)(uVar2 << ((byte)pD->m_successive_low & 0x1f));
      }
      iVar5 = iVar4 + 1;
    }
  }
  else {
LAB_0013f6f2:
    pD->m_eob_run = iVar5 + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_first(jpeg_decoder* pD, int component_id, int block_x, int block_y)
	{
		int k, s, r;

		if (pD->m_eob_run)
		{
			pD->m_eob_run--;
			return;
		}

		jpgd_block_coeff_t* p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);

		for (k = pD->m_spectral_start; k <= pD->m_spectral_end; k++)
		{
			unsigned int idx = pD->m_comp_ac_tab[component_id];
			if (idx >= JPGD_MAX_HUFF_TABLES)
				pD->stop_decoding(JPGD_DECODE_ERROR);

			s = pD->huff_decode(pD->m_pHuff_tabs[idx]);

			r = s >> 4;
			s &= 15;

			if (s)
			{
				if ((k += r) > 63)
					pD->stop_decoding(JPGD_DECODE_ERROR);

				r = pD->get_bits_no_markers(s);
				s = JPGD_HUFF_EXTEND(r, s);

				p[g_ZAG[k]] = static_cast<jpgd_block_coeff_t>(s << pD->m_successive_low);
			}
			else
			{
				if (r == 15)
				{
					if ((k += 15) > 63)
						pD->stop_decoding(JPGD_DECODE_ERROR);
				}
				else
				{
					pD->m_eob_run = 1 << r;

					if (r)
						pD->m_eob_run += pD->get_bits_no_markers(r);

					pD->m_eob_run--;

					break;
				}
			}
		}
	}